

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit.cc
# Opt level: O0

void ProcessByCount(void)

{
  int iVar1;
  ostream *poVar2;
  LimitCount limit;
  undefined4 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  LimitCount *in_stack_ffffffffffffffd0;
  LimitCount local_20;
  
  LimitCount::LimitCount(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  ResourceConsumingWorker();
  poVar2 = std::operator<<((ostream *)&std::cerr,"Resources remaining: ");
  iVar1 = LimitCount::ResourcesRemaining(&local_20);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  LimitCount::~LimitCount((LimitCount *)CONCAT44(iVar1,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

void ProcessByCount() {
  LimitCount limit(500);
  ResourceConsumingWorker();
  std::cerr << "Resources remaining: " << limit.ResourcesRemaining()
            << std::endl;
}